

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int ishashkey(context *ctx,lua_State *L,int index,int *key,uint32_t *keyhash,int *keytype)

{
  uint32_t uVar1;
  lua_Integer lVar2;
  char *str;
  char *s;
  size_t sz;
  int kt;
  int sizearray;
  int *keytype_local;
  uint32_t *keyhash_local;
  int *key_local;
  lua_State *plStack_20;
  int index_local;
  lua_State *L_local;
  context *ctx_local;
  
  sz._4_4_ = ctx->tbl->sizearray;
  _kt = keytype;
  keytype_local = (int *)keyhash;
  keyhash_local = (uint32_t *)key;
  key_local._4_4_ = index;
  plStack_20 = L;
  L_local = (lua_State *)ctx;
  sz._0_4_ = lua_type(L,index);
  if ((int)sz == 3) {
    lVar2 = lua_tointegerx(plStack_20,key_local._4_4_,(int *)0x0);
    *keyhash_local = (uint32_t)lVar2;
    if ((0 < (int)*keyhash_local) && ((int)*keyhash_local <= sz._4_4_)) {
      return 0;
    }
    *keytype_local = *keyhash_local;
    *_kt = 0;
  }
  else {
    s = (char *)0x0;
    str = lua_tolstring(plStack_20,key_local._4_4_,(size_t *)&s);
    uVar1 = calchash(str,(size_t)s);
    *keytype_local = uVar1;
    uVar1 = stringindex((context *)L_local,str,(size_t)s);
    *keyhash_local = uVar1;
    *_kt = 1;
  }
  return 1;
}

Assistant:

static int
ishashkey(struct context * ctx, lua_State *L, int index, int *key, uint32_t *keyhash, int *keytype) {
	int sizearray = ctx->tbl->sizearray;
	int kt = lua_type(L, index);
	if (kt == LUA_TNUMBER) {
		*key = lua_tointeger(L, index);
		if (*key > 0 && *key <= sizearray) {
			return 0;
		}
		*keyhash = (uint32_t)*key;
		*keytype = KEYTYPE_INTEGER;
	} else {
		size_t sz = 0;
		const char * s = lua_tolstring(L, index, &sz);
		*keyhash = calchash(s, sz);
		*key = stringindex(ctx, s, sz);
		*keytype = KEYTYPE_STRING;
	}
	return 1;
}